

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O1

int __thiscall ON_wString::Find(ON_wString *this,wchar_t *wcharString,size_t start_index)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  bool bVar4;
  bool bVar5;
  ON_Internal_Empty_wString *pOVar6;
  wchar_t *unaff_R12;
  wchar_t *string1;
  int element_count1;
  long lVar7;
  
  if (start_index < 0x7fffffff) {
    lVar7 = 0;
    if (wcharString != (wchar_t *)0x0) {
      do {
        if (wcharString[lVar7] == L'\0') goto LAB_006816a3;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x7ffffffd);
      lVar7 = 0x7ffffffd;
    }
LAB_006816a3:
    bVar4 = true;
    element_count1 = (int)lVar7;
    if (0 < element_count1) {
      pwVar3 = this->m_s;
      pOVar6 = &empty_wstring;
      if (pwVar3 != (wchar_t *)0x0) {
        pOVar6 = (ON_Internal_Empty_wString *)(pwVar3 + -3);
      }
      iVar1 = (pOVar6->header).string_length;
      if (((int)start_index < iVar1) && (element_count1 <= iVar1 - (int)start_index)) {
        lVar7 = (long)(iVar1 - element_count1);
        bVar4 = lVar7 < (long)start_index;
        if ((long)start_index <= lVar7) {
          wVar2 = *wcharString;
          unaff_R12 = pwVar3 + start_index;
          string1 = unaff_R12;
          do {
            if ((wVar2 == *string1) &&
               (bVar5 = EqualOrdinal(string1,element_count1,wcharString,element_count1,false), bVar5
               )) {
              unaff_R12 = (wchar_t *)((ulong)((long)unaff_R12 - (long)this->m_s) >> 2);
              break;
            }
            string1 = string1 + 1;
            unaff_R12 = unaff_R12 + 1;
            bVar4 = pwVar3 + lVar7 < string1;
          } while (string1 <= pwVar3 + lVar7);
        }
      }
    }
    if (!bVar4) {
      return (int)unaff_R12;
    }
  }
  return -1;
}

Assistant:

int ON_wString::Find(
  const wchar_t* wcharString,
  size_t start_index
  ) const
{
  if ( start_index < 0x7FFFFFFF )
  {
    const int start_index_as_int = (int)start_index;
    const int length = ON_wString::Length(wcharString);
    if (length > 0)
    {
      const int this_length = Length();
      if ( start_index_as_int < this_length && (this_length - start_index_as_int) >= length )
      {
        const wchar_t w0 = wcharString[0];
        const wchar_t* p1 = m_s + (this_length - length);
        for (const wchar_t* p = m_s + start_index_as_int; p <= p1; p++)
        {
          if (w0 == p[0] && ON_wString::EqualOrdinal(p, length, wcharString, length, false) )
            return ((int)(p - m_s));
        }
      }
    }
  }
  return -1;
}